

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DateFormatSymbols::DateFormatSymbols
          (DateFormatSymbols *this,Locale *locale,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateFormatSymbols_00479528;
  (this->fTimeSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->fTimeSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  Locale::Locale(&this->fZSFLocale);
  (this->fLocalPatternChars).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->fLocalPatternChars).fUnion.fStackFields.fLengthAndFlags = 2;
  initializeData(this,locale,(char *)0x0,status,'\0');
  return;
}

Assistant:

DateFormatSymbols::DateFormatSymbols(const Locale& locale,
                                     UErrorCode& status)
    : UObject()
{
  initializeData(locale, NULL,  status);
}